

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_long,int>
          (BaseAppender *this,Vector *col,unsigned_long input)

{
  int iVar1;
  
  iVar1 = Cast::Operation<unsigned_long,int>(input);
  *(int *)(col->data + (this->chunk).count * 4) = iVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}